

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

char * lua_tolstring(lua_State *L,int idx,size_t *len)

{
  TValue *pTVar1;
  ulong uVar2;
  GCstr *pGVar3;
  
  pTVar1 = index2adr(L,idx);
  if ((pTVar1->field_2).it == 0xfffffffb) {
    pGVar3 = (GCstr *)(ulong)(pTVar1->u32).lo;
  }
  else {
    if (0xfffeffff < (pTVar1->field_2).it) {
      if (len != (size_t *)0x0) {
        *len = 0;
      }
      return (char *)0x0;
    }
    uVar2 = (ulong)(L->glref).ptr32;
    if (*(uint *)(uVar2 + 0x24) <= *(uint *)(uVar2 + 0x20)) {
      lj_gc_step(L);
    }
    pTVar1 = index2adr(L,idx);
    pGVar3 = lj_str_fromnum(L,&pTVar1->n);
    (pTVar1->u32).lo = (uint32_t)pGVar3;
    (pTVar1->field_2).it = 0xfffffffb;
  }
  if (len != (size_t *)0x0) {
    *len = (ulong)pGVar3->len;
  }
  return (char *)(pGVar3 + 1);
}

Assistant:

LUA_API const char *lua_tolstring(lua_State *L, int idx, size_t *len)
{
  TValue *o = index2adr(L, idx);
  GCstr *s;
  if (LJ_LIKELY(tvisstr(o))) {
    s = strV(o);
  } else if (tvisnumber(o)) {
    lj_gc_check(L);
    o = index2adr(L, idx);  /* GC may move the stack. */
    s = lj_str_fromnumber(L, o);
    setstrV(L, o, s);
  } else {
    if (len != NULL) *len = 0;
    return NULL;
  }
  if (len != NULL) *len = s->len;
  return strdata(s);
}